

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.cpp
# Opt level: O1

bool __thiscall SudokuGenerator::generateCell(SudokuGenerator *this,uint row,uint column)

{
  SudokuGitter *this_00;
  _Rb_tree_header *p_Var1;
  pointer __first;
  pointer __last;
  bool bVar2;
  uint uVar3;
  cell cVar4;
  ulong uVar5;
  ostream *poVar6;
  size_t __i;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  pointer pcVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> options;
  vector<cell,_std::allocator<cell>_> currCol;
  vector<cell,_std::allocator<cell>_> currRow;
  vector<cell,_std::allocator<cell>_> quad;
  vector<cell,_std::allocator<cell>_> ziffern;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2928;
  long local_2908;
  ulong local_2900;
  vector<cell,_std::allocator<cell>_> local_28f8;
  vector<cell,_std::allocator<cell>_> local_28e0;
  vector<cell,_std::allocator<cell>_> local_28c8;
  ulong local_28b0;
  ulong local_28a8;
  vector<cell,_std::allocator<cell>_> local_28a0;
  string local_2888;
  string local_2868;
  string local_2848;
  string local_2828;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2808;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_27d8;
  vector<cell,_std::allocator<cell>_> local_27c0;
  vector<cell,_std::allocator<cell>_> local_27a8;
  vector<cell,_std::allocator<cell>_> local_2790;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2778;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::vector<cell,_std::allocator<cell>_>::vector
            (&local_28a0,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  pcVar11 = local_28a0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->gitter).elements != 0) {
    uVar13 = 0;
    do {
      uVar5 = uVar13 + 1;
      local_28a0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13].value = (uint)uVar5;
      local_28a0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13].isStatic = false;
      uVar13 = uVar5;
    } while (uVar5 < (this->gitter).elements);
  }
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  this_00 = &this->gitter;
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar7 = 1;
  uVar13 = local_2740._M_x[0];
  do {
    uVar13 = (ulong)(((uint)(uVar13 >> 0x1e) ^ (uint)uVar13) * 0x6c078965 + (int)lVar7);
    local_2740._M_x[lVar7] = uVar13;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_2740._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<cell*,std::vector<cell,std::allocator<cell>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>)pcVar11,
             (__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>)
             local_28a0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_2740);
  std::random_device::_M_fini();
  std::vector<cell,_std::allocator<cell>_>::vector
            (&local_28c8,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  std::vector<cell,_std::allocator<cell>_>::vector
            (&local_28e0,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  std::vector<cell,_std::allocator<cell>_>::vector
            (&local_28f8,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  local_2908 = (ulong)row * 3;
  std::vector<cell,_std::allocator<cell>_>::operator=
            (&local_28e0,
             (this_00->cells).
             super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + row);
  if ((this->gitter).elements != 0) {
    uVar13 = 0;
    do {
      cVar4 = SudokuGitter::getCell(this_00,(uint)uVar13,column);
      local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13].value = cVar4.value;
      local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13].isStatic = cVar4.isStatic;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (this->gitter).elements);
  }
  uVar3 = (this->gitter).quadHeight;
  lVar7 = 0;
  uVar8 = row - row % uVar3;
  local_2900 = (ulong)column;
  if (uVar8 < uVar3 + uVar8) {
    uVar10 = column - column % (this->gitter).quadWidth;
    uVar3 = uVar8;
    do {
      if (uVar10 < (this->gitter).quadWidth + uVar10) {
        lVar7 = (long)(int)lVar7;
        uVar12 = uVar10;
        do {
          cVar4 = SudokuGitter::getCell(this_00,uVar3,uVar12);
          local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar7].value = cVar4.value;
          local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar7].isStatic = cVar4.isStatic;
          lVar7 = lVar7 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 < (this->gitter).quadWidth + uVar10);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->gitter).quadHeight + uVar8);
  }
  local_2808._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2808._M_impl.super__Rb_tree_header._M_header;
  local_2808._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2808._M_impl._0_8_ = 0;
  local_2808._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2808._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2808._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2808._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2808._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_28e0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_28e0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pcVar11 = local_28e0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_2740._M_x[0] = CONCAT44(local_2740._M_x[0]._4_4_,pcVar11->value);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_2808,(int *)&local_2740);
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 !=
             local_28e0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pcVar11 = local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_2740._M_x[0] = CONCAT44(local_2740._M_x[0]._4_4_,pcVar11->value);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_2808,(int *)&local_2740);
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 !=
             local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pcVar11 = local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_2740._M_x[0] = CONCAT44(local_2740._M_x[0]._4_4_,pcVar11->value);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_2808,(int *)&local_2740);
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 !=
             local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  p_Var1 = &local_2778._M_impl.super__Rb_tree_header;
  local_2778._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2778._M_impl._0_8_ = 0;
  local_2778._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2778._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2778._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2778._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2778._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((this->gitter).elements != 0) {
    uVar3 = 1;
    do {
      local_2740._M_x[0] = CONCAT44(local_2740._M_x[0]._4_4_,uVar3);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_2778,(int *)&local_2740);
      uVar3 = uVar3 + 1;
    } while (uVar3 <= (this->gitter).elements);
  }
  local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_2778._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
             local_2808._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_2808._M_impl.super__Rb_tree_header,&local_2928,0);
  __last = local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_13b8);
  uVar13 = local_2900;
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar7 = 1;
  uVar5 = local_2740._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar7);
    local_2740._M_x[lVar7] = uVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  local_2740._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last,&local_2740);
  std::random_device::_M_fini();
  uVar3 = (uint)uVar13;
  bVar14 = (this->gitter).elements == uVar3;
  uVar8 = row;
  if (bVar14) {
    uVar8 = row + 1;
  }
  uVar10 = 0;
  if (!bVar14) {
    uVar10 = uVar3 + 1;
  }
  if (local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_28a8 = (ulong)(row + 1);
    local_28b0 = (ulong)(uVar3 + 1);
    uVar5 = 0;
    uVar9 = 1;
    do {
      uVar12 = local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"###",3);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Versuch ",10);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,anon_var_dwarf_3027a,0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::vector<cell,_std::allocator<cell>_>::vector(&local_2790,&local_28e0);
      local_2828._M_dataplus._M_p = (pointer)&local_2828.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2828,"Row","");
      SudokuGitter::printCellVec(&local_2790,&local_2828);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2828._M_dataplus._M_p != &local_2828.field_2) {
        operator_delete(local_2828._M_dataplus._M_p);
      }
      if (local_2790.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_2790.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<cell,_std::allocator<cell>_>::vector(&local_27a8,&local_28f8);
      local_2848._M_dataplus._M_p = (pointer)&local_2848.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2848,"Column","");
      SudokuGitter::printCellVec(&local_27a8,&local_2848);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2848._M_dataplus._M_p != &local_2848.field_2) {
        operator_delete(local_2848._M_dataplus._M_p);
      }
      if (local_27a8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_27a8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<cell,_std::allocator<cell>_>::vector(&local_27c0,&local_28c8);
      local_2868._M_dataplus._M_p = (pointer)&local_2868.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2868,"Quad","");
      SudokuGitter::printCellVec(&local_27c0,&local_2868);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2868._M_dataplus._M_p != &local_2868.field_2) {
        operator_delete(local_2868._M_dataplus._M_p);
      }
      if (local_27c0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_27c0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_27d8,&local_2928);
      local_2888._M_dataplus._M_p = (pointer)&local_2888.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2888,"Options","");
      SudokuGitter::printIntVec(&local_27d8,&local_2888);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2888._M_dataplus._M_p != &local_2888.field_2) {
        operator_delete(local_2888._M_dataplus._M_p);
      }
      if (local_27d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_27d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      SudokuGitter::setCell(this_00,row,uVar3,uVar12);
      bVar14 = true;
      if ((this->gitter).elements - 1 == uVar3) goto LAB_00115575;
      bVar2 = generateCell(this,uVar8,uVar10);
      if (bVar2) goto LAB_00115575;
      bVar14 = uVar9 < (ulong)((long)local_2928.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2928.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar5 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar14);
  }
  uVar13 = uVar13 & 0xffffffff;
  if (*(char *)(*(long *)((long)&(((this_00->cells).
                                   super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<cell,_std::allocator<cell>_>)._M_impl +
                         local_2908 * 8) + 4 + uVar13 * 8) == '\x01') {
    bVar2 = generateCell(this,uVar8,uVar10);
    bVar14 = true;
    if (bVar2) goto LAB_00115575;
  }
  lVar7 = *(long *)((long)&(((this_00->cells).
                             super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<cell,_std::allocator<cell>_>)._M_impl + local_2908 * 8
                   );
  *(undefined4 *)(lVar7 + uVar13 * 8) = 0;
  *(undefined1 *)(lVar7 + 4 + uVar13 * 8) = 0;
  bVar14 = false;
LAB_00115575:
  if (local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_2928.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2778);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2808);
  if (local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28f8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_28e0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28e0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28c8.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_28a0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start != (cell *)0x0) {
    operator_delete(local_28a0.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar14;
}

Assistant:

bool SudokuGenerator::generateCell(unsigned int row, unsigned int column) {
    vector<cell> ziffern(gitter.getElements());
    for (unsigned int i = 0; i < gitter.getElements(); i++)
        ziffern[i] = cell(i + 1);
    shuffle(begin(ziffern), end(ziffern), std::mt19937(std::random_device()()));

    vector<cell> quad(gitter.getElements());
    vector<cell> currRow(gitter.getElements());
    vector<cell> currCol(gitter.getElements());

    // Row Werte merken
    currRow = gitter.cells[row];
    // Column Werte merken
    for (unsigned int tmpRow = 0; tmpRow < gitter.getElements(); tmpRow++) {
        currCol[tmpRow] = gitter.getCell(tmpRow, column);
    }

    // Quad Werte merken
    auto quadStartRow = (row / gitter.getQuadHeight()) * gitter.getQuadHeight();
    auto quadStartCol = (column / gitter.getQuadWidth()) * gitter.getQuadWidth();

    int indexQuad = 0;
    for (auto tmpRow = quadStartRow; tmpRow < quadStartRow + gitter.getQuadHeight(); tmpRow++) {
        for (auto tmpCol = quadStartCol; tmpCol < quadStartCol + gitter.getQuadWidth(); tmpCol++) {
            quad[indexQuad] = gitter.getCell(tmpRow, tmpCol);
            indexQuad++;
        }
    }

    set<int> neighbours = {};

    for (auto val : currRow) {
        neighbours.insert(val.value);
    }
    for (auto val : currCol) {
        neighbours.insert(val.value);
    }
    for (auto val : quad) {
        neighbours.insert(val.value);
    }

    set<int> values = {};

    for (unsigned int i = 1; i <= gitter.getElements(); i++)
        values.insert(i);

    vector<unsigned int> options;
    set_difference(values.begin(), values.end(), neighbours.begin(), neighbours.end(),
                   inserter(options, options.begin()));

    shuffle(begin(options), end(options), std::mt19937(std::random_device()()));

    unsigned int nextRow = row;
    unsigned int nextCol = column + 1;
    if (column == gitter.getElements()) {
        nextCol = 0;
        nextRow++;
    }

    for (unsigned int i = 0; i < options.size(); i++) {
        auto tmp = static_cast<unsigned int>(options[i]);

        std::cout << "###" << row + 1 << "," << column + 1 << ": Versuch " << tmp << " einzufügen. Umgebung: "
                  << std::endl;
        SudokuGitter::printCellVec(currRow, "Row");
        SudokuGitter::printCellVec(currCol, "Column");
        SudokuGitter::printCellVec(quad, "Quad");
        SudokuGitter::printIntVec(options, "Options");


        //gitter.cells[row][column] = cell(tmp);
        gitter.setCell(row, column, tmp);

        if ((column == gitter.getElements() - 1) || generateCell(nextRow, nextCol)) {
            return true;
        }
    }

    // Wenn feste variable gehe immer weiter da ist nix zu tun
    if (gitter.cells[row][column].isStatic && generateCell(nextRow, nextCol)) {
        return true;
    }

    // Fehler. Keine Option vorhanden um die Zelle zu setzen
    gitter.cells[row][column] = cell(0);
    return false;
}